

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerInvisibility::EndEffect(APowerInvisibility *this)

{
  AActor *pAVar1;
  DObject *pDVar2;
  AInventory *pAVar3;
  PClass *pPVar4;
  AInventory *pAVar5;
  PClass *pPVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *paVar7;
  bool bVar8;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar1 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar1 != (AActor *)0x0) {
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (pAVar1->flags).Value =
           (pAVar1->flags).Value &
           (~(this->super_APowerup).super_AInventory.super_AActor.flags.Value | 0xfffbffff);
      (pAVar1->flags3).Value =
           (pAVar1->flags3).Value &
           (~(this->super_APowerup).super_AInventory.super_AActor.flags3.Value | 0xfffffff7);
      (pAVar1->flags5).Value =
           (pAVar1->flags5).Value &
           (~(this->super_APowerup).super_AInventory.super_AActor.flags5.Value | 0xefffffff);
      pAVar1->RenderStyle = LegacyRenderStyles[1];
      pDVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.o;
      pDVar2[6].Class = (PClass *)0x3ff0000000000000;
      pAVar3 = (AInventory *)pDVar2[0x16]._vptr_DObject;
      if (pAVar3 == (AInventory *)0x0) {
        return;
      }
      if (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        do {
          pAVar5 = pAVar3;
          pPVar4 = RegistrationInfo.MyClass;
          pPVar6 = *(PClass **)((long)&(pAVar5->super_AActor).super_DThinker + 8);
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)
                     (*(code *)**(undefined8 **)&(pAVar5->super_AActor).super_DThinker)(pAVar5);
            *(PClass **)((long)&(pAVar5->super_AActor).super_DThinker + 8) = pPVar6;
          }
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar4 && bVar8) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar8 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar4) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if ((pAVar5 != (AInventory *)this) && (bVar8)) {
            (**(code **)(*(long *)&(pAVar5->super_AActor).super_DThinker + 0x160))(pAVar5);
          }
          pAVar3 = (((APowerup *)&pAVar5->super_AActor)->super_AInventory).super_AActor.Inventory.
                   field_0.p;
          if (pAVar3 == (AInventory *)0x0) {
            return;
          }
        } while (((pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        paVar7 = &(pAVar5->super_AActor).Inventory.field_0;
      }
      else {
        paVar7 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *)(pDVar2 + 0x16);
      }
    }
    else {
      paVar7 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *)
               &(this->super_APowerup).super_AInventory.Owner;
    }
    *paVar7 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)0x0;
  }
  return;
}

Assistant:

void APowerInvisibility::EndEffect ()
{
	Super::EndEffect();
	if (Owner != NULL)
	{
		Owner->flags  &= ~(flags  & INVISIBILITY_FLAGS1);
		Owner->flags3 &= ~(flags3 & INVISIBILITY_FLAGS3);
		Owner->flags5 &= ~(flags5 & INVISIBILITY_FLAGS5);

		Owner->RenderStyle = STYLE_Normal;
		Owner->Alpha = 1.;

		// Check whether there are other invisibility items and refresh their effect.
		// If this isn't done there will be one incorrectly drawn frame when this
		// item expires.
		AInventory *item = Owner->Inventory;
		while (item != NULL)
		{
			if (item->IsKindOf(RUNTIME_CLASS(APowerInvisibility)) && item != this)
			{
				static_cast<APowerInvisibility*>(item)->DoEffect();
			}
			item = item->Inventory;
		}
	}
}